

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

int Abc_GraphDeriveGia_rec
              (Gia_Man_t *p,int Lev,int Node,Vec_Wec_t *vNodes,int **pCache,int *pBuffer,
              Vec_Int_t *vEdges)

{
  int iVar1;
  int iVar2;
  int iCtrl;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pObj;
  int Res1;
  int Res0;
  int *pBuffer_local;
  int **pCache_local;
  Vec_Wec_t *vNodes_local;
  int Node_local;
  int Lev_local;
  Gia_Man_t *p_local;
  
  if (Node == -2) {
    p_local._4_4_ = 1;
  }
  else if (Node == -1) {
    p_local._4_4_ = 0;
  }
  else if (pCache[Lev][Node] == -1) {
    pBuffer[Lev] = 0;
    pVVar3 = Vec_WecEntry(vNodes,Lev);
    iVar1 = Vec_IntEntry(pVVar3,Node << 1);
    iVar1 = Abc_GraphDeriveGia_rec(p,Lev + 1,iVar1,vNodes,pCache,pBuffer,vEdges);
    pBuffer[Lev] = 1;
    pVVar3 = Vec_WecEntry(vNodes,Lev);
    iVar2 = Vec_IntEntry(pVVar3,Node * 2 + 1);
    iVar2 = Abc_GraphDeriveGia_rec(p,Lev + 1,iVar2,vNodes,pCache,pBuffer,vEdges);
    pObj = Gia_ManCi(p,Lev);
    iCtrl = Gia_Obj2Lit(p,pObj);
    p_local._4_4_ = Gia_ManHashMux(p,iCtrl,iVar2,iVar1);
    pCache[Lev][Node] = p_local._4_4_;
  }
  else {
    p_local._4_4_ = pCache[Lev][Node];
  }
  return p_local._4_4_;
}

Assistant:

int Abc_GraphDeriveGia_rec( Gia_Man_t * p, int Lev, int Node, Vec_Wec_t * vNodes, int ** pCache, int * pBuffer, Vec_Int_t * vEdges )
{
    int Res0, Res1;
    if ( Node == -2 )
        return 1;
    if ( Node == -1 )
        return 0;
    if ( pCache[Lev][Node] != -1 )
        return pCache[Lev][Node];
    pBuffer[Lev] = 0;
    Res0 = Abc_GraphDeriveGia_rec( p, Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node   ), vNodes, pCache, pBuffer, vEdges );
    pBuffer[Lev] = 1;
    Res1 = Abc_GraphDeriveGia_rec( p, Lev+1, Vec_IntEntry( Vec_WecEntry(vNodes, Lev), 2*Node+1 ), vNodes, pCache, pBuffer, vEdges );
    return ( pCache[Lev][Node] = Gia_ManHashMux(p, Gia_Obj2Lit(p, Gia_ManCi(p, Lev)), Res1, Res0) );
}